

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::GraphicsRobustAccessPass::MakeRuntimeArrayLengthInst
          (GraphicsRobustAccessPass *this,Instruction *access_chain,uint32_t operand_index)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  int iVar4;
  TypeManager *this_00;
  Instruction *pIVar5;
  Instruction *this_01;
  Operand *pOVar6;
  ConstantManager *this_02;
  Constant *this_03;
  uint64_t uVar7;
  Type *pTVar8;
  undefined4 extraout_var;
  Instruction *pIVar9;
  undefined4 extraout_var_00;
  long lVar10;
  uint uVar11;
  uint uVar12;
  Instruction *this_04;
  long lVar13;
  uint uVar14;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  Instruction *local_2c8;
  uint local_2b0;
  uint32_t local_2ac;
  Integer uint_type_for_query;
  SmallVector<unsigned_int,_2UL> local_278;
  SmallVector<unsigned_int,_2UL> local_250;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  OperandList ops;
  SmallVector<unsigned_int,_2UL> local_1d0;
  undefined1 local_1a8 [376];
  
  this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
  local_2c8 = (Instruction *)0x0;
  pIVar5 = access_chain;
  uVar14 = 2;
  pIVar9 = local_2c8;
  while( true ) {
    while( true ) {
      local_2c8 = pIVar9;
      uVar12 = uVar14;
      this_04 = pIVar5;
      if (uVar12 == 0) {
        if (local_2c8 != (Instruction *)0x0) {
          uVar1 = Instruction::type_id(local_2c8);
          pTVar8 = analysis::TypeManager::GetType(this_00,uVar1);
          iVar4 = (*pTVar8->_vptr_Type[0x21])(pTVar8);
          lVar10 = (**(code **)(**(long **)(CONCAT44(extraout_var_00,iVar4) + 0x28) + 0xf0))();
          lVar13 = *(long *)(lVar10 + 0x30);
          lVar10 = *(long *)(lVar10 + 0x28);
          uVar1 = Pass::TakeNextId(&this->super_Pass);
          uint_type_for_query.super_Type.decorations_.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          uint_type_for_query.super_Type.decorations_.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          uint_type_for_query.super_Type.decorations_.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          uint_type_for_query.super_Type.kind_ = kInteger;
          uint_type_for_query.super_Type._36_4_ = 0x20;
          uint_type_for_query.super_Type._vptr_Type = (_func_int **)&PTR__Type_00a6c948;
          uint_type_for_query.signed_ = false;
          pTVar8 = analysis::TypeManager::GetRegisteredType(this_00,&uint_type_for_query.super_Type)
          ;
          uVar3 = analysis::TypeManager::GetId(this_00,pTVar8);
          local_2ac = Instruction::result_id(local_2c8);
          init_list._M_len = 1;
          init_list._M_array = &local_2ac;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_278,init_list);
          ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(ops.
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
          utils::SmallVector<unsigned_int,_2UL>::SmallVector
                    ((SmallVector<unsigned_int,_2UL> *)
                     &ops.
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_finish,&local_278);
          init_list_00._M_len = 1;
          init_list_00._M_array = &local_2b0;
          local_2b0 = (int)((ulong)(lVar13 - lVar10) >> 3) - 1;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_250,init_list_00);
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1d0,&local_250);
          local_228 = 0;
          uStack_220 = 0;
          local_218 = 0;
          std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
          _M_range_initialize<spvtools::opt::Operand_const*>
                    ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                     &local_228,&ops,local_1a8);
          pIVar5 = InsertInst(this,access_chain,OpArrayLength,uVar3,uVar1,(OperandList *)&local_228)
          ;
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                     &local_228);
          lVar13 = 0x38;
          do {
            utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                      ((SmallVector<unsigned_int,_2UL> *)
                       ((long)&ops.
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar13));
            lVar13 = lVar13 + -0x30;
          } while (lVar13 != -0x28);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_250);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_278);
          analysis::Type::~Type(&uint_type_for_query.super_Type);
          return pIVar5;
        }
        __assert_fail("pointer_to_containing_struct",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/graphics_robust_access_pass.cpp"
                      ,0x308,
                      "Instruction *spvtools::opt::GraphicsRobustAccessPass::MakeRuntimeArrayLengthInst(Instruction *, uint32_t)"
                     );
      }
      if (this_04->opcode_ != OpCopyObject) break;
      uVar1 = Instruction::GetSingleWordInOperand(this_04,0);
      pIVar5 = GetDef(this,uVar1);
      uVar14 = uVar12;
      pIVar9 = local_2c8;
    }
    if (1 < this_04->opcode_ - OpAccessChain) break;
    uVar11 = operand_index - 2;
    if (this_04 != access_chain) {
      uVar1 = Instruction::NumInOperands(this_04);
      uVar11 = uVar1 - 1;
    }
    uVar1 = Instruction::GetSingleWordInOperand(this_04,0);
    this_01 = GetDef(this,uVar1);
    uVar2 = uVar12 - uVar11;
    pIVar5 = this_04;
    uVar14 = 0;
    pIVar9 = this_01;
    if ((uVar2 != 0) &&
       (pIVar5 = this_01, uVar14 = uVar2, pIVar9 = local_2c8, uVar12 < uVar11 || uVar2 == 0)) {
      ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pOVar6 = Instruction::GetOperand(this_04,2);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                (&ops,pOVar6);
      for (uVar14 = 0; uVar14 <= uVar11 + ~uVar12; uVar14 = uVar14 + 1) {
        pOVar6 = Instruction::GetOperand(this_04,uVar14 + 3);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                  (&ops,pOVar6);
      }
      this_02 = IRContext::get_constant_mgr((this->super_Pass).context_);
      uint_type_for_query.super_Type._vptr_Type = (_func_int **)0x0;
      uint_type_for_query.super_Type.decorations_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      uint_type_for_query.super_Type.decorations_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      for (uVar1 = 3;
          (ulong)(uVar1 - 3) <
          ((long)ops.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)ops.
                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x30 - 1U; uVar1 = uVar1 + 1) {
        local_278._vptr_SmallVector._0_4_ = 0;
        uVar3 = Instruction::GetSingleWordOperand(this_04,uVar1);
        pIVar5 = GetDef(this,uVar3);
        this_03 = analysis::ConstantManager::GetConstantFromInst(this_02,pIVar5);
        if (this_03 == (Constant *)0x0) {
          local_278._vptr_SmallVector._0_4_ = 0;
        }
        else {
          uVar7 = analysis::Constant::GetZeroExtendedValue(this_03);
          local_278._vptr_SmallVector._0_4_ = (undefined4)uVar7;
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&uint_type_for_query,
                   (value_type_conflict1 *)&local_278);
      }
      uVar1 = Instruction::type_id(this_01);
      pTVar8 = analysis::TypeManager::GetType(this_00,uVar1);
      iVar4 = (*pTVar8->_vptr_Type[0x21])(pTVar8);
      pTVar8 = analysis::TypeManager::GetMemberType
                         (this_00,*(Type **)(CONCAT44(extraout_var,iVar4) + 0x28),
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &uint_type_for_query);
      uVar1 = analysis::TypeManager::GetId(this_00,pTVar8);
      uVar1 = analysis::TypeManager::FindPointerToType
                        (this_00,uVar1,*(StorageClass *)(CONCAT44(extraout_var,iVar4) + 0x30));
      uVar3 = Pass::TakeNextId(&this->super_Pass);
      pIVar9 = InsertInst(this,this_04,this_04->opcode_,uVar1,uVar3,&ops);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&uint_type_for_query);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&ops);
      pIVar5 = this_04;
      uVar14 = 0;
    }
  }
  Fail((DiagnosticStream *)&ops,this);
  std::operator<<((ostream *)&ops,
                  "Unhandled access chain in logical addressing mode passes through ");
  Instruction::PrettyPrint_abi_cxx11_((string *)&uint_type_for_query,this_04,0x50);
  std::operator<<((ostream *)&ops,(string *)&uint_type_for_query);
  std::__cxx11::string::_M_dispose();
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&ops);
  return (Instruction *)0x0;
}

Assistant:

Instruction* GraphicsRobustAccessPass::MakeRuntimeArrayLengthInst(
    Instruction* access_chain, uint32_t operand_index) {
  // The Index parameter to the access chain at |operand_index| is indexing
  // *into* the runtime-array.  To get the number of elements in the runtime
  // array we need a pointer to the Block-decorated struct that contains the
  // runtime array. So conceptually we have to go 2 steps backward in the
  // access chain.  The two steps backward might forces us to traverse backward
  // across multiple dominating instructions.
  auto* type_mgr = context()->get_type_mgr();

  // How many access chain indices do we have to unwind to find the pointer
  // to the struct containing the runtime array?
  uint32_t steps_remaining = 2;
  // Find or create an instruction computing the pointer to the structure
  // containing the runtime array.
  // Walk backward through pointer address calculations until we either get
  // to exactly the right base pointer, or to an access chain instruction
  // that we can replicate but truncate to compute the address of the right
  // struct.
  Instruction* current_access_chain = access_chain;
  Instruction* pointer_to_containing_struct = nullptr;
  while (steps_remaining > 0) {
    switch (current_access_chain->opcode()) {
      case spv::Op::OpCopyObject:
        // Whoops. Walk right through this one.
        current_access_chain =
            GetDef(current_access_chain->GetSingleWordInOperand(0));
        break;
      case spv::Op::OpAccessChain:
      case spv::Op::OpInBoundsAccessChain: {
        const int first_index_operand = 3;
        // How many indices in this access chain contribute to getting us
        // to an element in the runtime array?
        const auto num_contributing_indices =
            current_access_chain == access_chain
                ? operand_index - (first_index_operand - 1)
                : current_access_chain->NumInOperands() - 1 /* skip the base */;
        Instruction* base =
            GetDef(current_access_chain->GetSingleWordInOperand(0));
        if (num_contributing_indices == steps_remaining) {
          // The base pointer points to the structure.
          pointer_to_containing_struct = base;
          steps_remaining = 0;
          break;
        } else if (num_contributing_indices < steps_remaining) {
          // Peel off the index and keep going backward.
          steps_remaining -= num_contributing_indices;
          current_access_chain = base;
        } else {
          // This access chain has more indices than needed.  Generate a new
          // access chain instruction, but truncating the list of indices.
          const int base_operand = 2;
          // We'll use the base pointer and the indices up to but not including
          // the one indexing into the runtime array.
          Instruction::OperandList ops;
          // Use the base pointer
          ops.push_back(current_access_chain->GetOperand(base_operand));
          const uint32_t num_indices_to_keep =
              num_contributing_indices - steps_remaining - 1;
          for (uint32_t i = 0; i <= num_indices_to_keep; i++) {
            ops.push_back(
                current_access_chain->GetOperand(first_index_operand + i));
          }
          // Compute the type of the result of the new access chain.  Start at
          // the base and walk the indices in a forward direction.
          auto* constant_mgr = context()->get_constant_mgr();
          std::vector<uint32_t> indices_for_type;
          for (uint32_t i = 0; i < ops.size() - 1; i++) {
            uint32_t index_for_type_calculation = 0;
            Instruction* index =
                GetDef(current_access_chain->GetSingleWordOperand(
                    first_index_operand + i));
            if (auto* index_constant =
                    constant_mgr->GetConstantFromInst(index)) {
              // We only need 32 bits. For the type calculation, it's sufficient
              // to take the zero-extended value. It only matters for the struct
              // case, and struct member indices are unsigned.
              index_for_type_calculation =
                  uint32_t(index_constant->GetZeroExtendedValue());
            } else {
              // Indexing into a variably-sized thing like an array.  Use 0.
              index_for_type_calculation = 0;
            }
            indices_for_type.push_back(index_for_type_calculation);
          }
          auto* base_ptr_type = type_mgr->GetType(base->type_id())->AsPointer();
          auto* base_pointee_type = base_ptr_type->pointee_type();
          auto* new_access_chain_result_pointee_type =
              type_mgr->GetMemberType(base_pointee_type, indices_for_type);
          const uint32_t new_access_chain_type_id = type_mgr->FindPointerToType(
              type_mgr->GetId(new_access_chain_result_pointee_type),
              base_ptr_type->storage_class());

          // Create the instruction and insert it.
          const auto new_access_chain_id = TakeNextId();
          auto* new_access_chain =
              InsertInst(current_access_chain, current_access_chain->opcode(),
                         new_access_chain_type_id, new_access_chain_id, ops);
          pointer_to_containing_struct = new_access_chain;
          steps_remaining = 0;
          break;
        }
      } break;
      default:
        Fail() << "Unhandled access chain in logical addressing mode passes "
                  "through "
               << current_access_chain->PrettyPrint(
                      SPV_BINARY_TO_TEXT_OPTION_SHOW_BYTE_OFFSET |
                      SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
        return nullptr;
    }
  }
  assert(pointer_to_containing_struct);
  auto* pointee_type =
      type_mgr->GetType(pointer_to_containing_struct->type_id())
          ->AsPointer()
          ->pointee_type();

  auto* struct_type = pointee_type->AsStruct();
  const uint32_t member_index_of_runtime_array =
      uint32_t(struct_type->element_types().size() - 1);
  // Create the length-of-array instruction before the original access chain,
  // but after the generation of the pointer to the struct.
  const auto array_len_id = TakeNextId();
  analysis::Integer uint_type_for_query(32, false);
  auto* uint_type = type_mgr->GetRegisteredType(&uint_type_for_query);
  auto* array_len = InsertInst(
      access_chain, spv::Op::OpArrayLength, type_mgr->GetId(uint_type),
      array_len_id,
      {{SPV_OPERAND_TYPE_ID, {pointer_to_containing_struct->result_id()}},
       {SPV_OPERAND_TYPE_LITERAL_INTEGER, {member_index_of_runtime_array}}});
  return array_len;
}